

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme_Constant.cpp
# Opt level: O1

RepresentationSuffix __thiscall psy::C::IntegerConstant::representationSuffix(IntegerConstant *this)

{
  uint uVar1;
  RepresentationSuffix RVar2;
  
  uVar1 = *(uint *)&(this->super_Lexeme).field_0;
  if ((uVar1 >> 10 & 1) != 0) {
    return (uVar1 & 0x280) == 0 ^ llOrLLAnduOrU;
  }
  if ((uVar1 & 0x60) != 0) {
    return (uVar1 & 0x280) == 0 ^ lOrLAnduOrU;
  }
  RVar2 = uOrU;
  if (-1 < (char)uVar1) {
    RVar2 = (RepresentationSuffix)(uVar1 >> 9) & uOrU;
  }
  return RVar2;
}

Assistant:

IntegerConstant::RepresentationSuffix IntegerConstant::representationSuffix() const
{
    if (F_.llOrLL_) {
        return (F_.u_ || F_.U_)
                ? RepresentationSuffix::llOrLLAnduOrU
                : RepresentationSuffix::llOrLL;
    }
    if (F_.l_ || F_.L_) {
        return (F_.u_ || F_.U_)
                ? RepresentationSuffix::lOrLAnduOrU
                : RepresentationSuffix::lOrL;
    }
    return (F_.u_ || F_.U_)
            ? RepresentationSuffix::uOrU
            : RepresentationSuffix::None;
}